

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O0

int pt_time_update_tma(pt_time *time,pt_packet_tma *packet,pt_config *config)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint64_t fc;
  uint32_t ctc_mask;
  uint32_t mtc_hi;
  uint32_t mtc_freq;
  uint32_t ctc;
  pt_config *config_local;
  pt_packet_tma *packet_local;
  pt_time *time_local;
  
  if (((time == (pt_time *)0x0) || (packet == (pt_packet_tma *)0x0)) || (config == (pt_config *)0x0)
     ) {
    time_local._4_4_ = -1;
  }
  else if ((time->field_0x29 & 1) == 0) {
    time_local._4_4_ = -6;
  }
  else if (((byte)time->field_0x29 >> 2 & 1) == 0) {
    if (((byte)time->field_0x29 >> 3 & 1) == 0) {
      uVar1 = packet->ctc;
      uVar2 = packet->fc;
      uVar3 = config->mtc_freq + 8;
      time->field_0x29 = time->field_0x29 & 0xfb | 4;
      time->base = time->base - (ulong)uVar2;
      time->fc = (ulong)uVar2 + time->fc;
      if (uVar3 < 0x11) {
        time->field_0x29 = time->field_0x29 & 0xf7 | 8;
      }
      uVar3 = (uint)uVar1 & (1 << ((byte)uVar3 & 0x1f)) - 1U;
      time->ctc_cyc = uVar3;
      time->ctc = uVar3;
      time_local._4_4_ = 0;
    }
    else {
      time_local._4_4_ = -1;
    }
  }
  else {
    time_local._4_4_ = -6;
  }
  return time_local._4_4_;
}

Assistant:

int pt_time_update_tma(struct pt_time *time,
		       const struct pt_packet_tma *packet,
		       const struct pt_config *config)
{
	uint32_t ctc, mtc_freq, mtc_hi, ctc_mask;
	uint64_t fc;

	if (!time || !packet || !config)
		return -pte_internal;

	/* Without a TSC something is seriously wrong. */
	if (!time->have_tsc)
		return -pte_bad_context;

	/* We shouldn't have more than one TMA per TSC. */
	if (time->have_tma)
		return -pte_bad_context;

	/* We're ignoring MTC between TSC and TMA. */
	if (time->have_mtc)
		return -pte_internal;

	ctc = packet->ctc;
	fc = packet->fc;

	mtc_freq = config->mtc_freq;
	mtc_hi = mtc_freq + pt_pl_mtc_bit_size;

	/* A mask for the relevant CTC bits ignoring high-order bits that are
	 * not provided by MTC.
	 */
	ctc_mask = (1u << mtc_hi) - 1u;

	time->have_tma = 1;
	time->base -= fc;
	time->fc += fc;

	/* If the MTC frequency is low enough that TMA provides the full CTC
	 * value, we can use the TMA as an MTC.
	 *
	 * If it isn't, we will estimate the preceding MTC based on the CTC bits
	 * the TMA provides at the next MTC.  We forget about the previous MTC
	 * in this case.
	 *
	 * If no MTC packets are dropped around TMA, we will estimate the
	 * forgotten value again at the next MTC.
	 *
	 * If MTC packets are dropped, we can't really tell where in this
	 * extended MTC period the TSC occurred.  The estimation will place it
	 * right before the next MTC.
	 */
	if (mtc_hi <= pt_pl_tma_ctc_bit_size)
		time->have_mtc = 1;

	/* In both cases, we store the TMA's CTC bits until the next MTC. */
	time->ctc = time->ctc_cyc = ctc & ctc_mask;

	return 0;
}